

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestEqualsSimilar_Test::TestBody
          (AckMessageTest_TestEqualsSimilar_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AckMessage newMessage;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  hash<bidfx_public_api::price::pixie::AckMessage> local_52;
  hash<bidfx_public_api::price::pixie::AckMessage> local_51;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AckMessage local_40 [48];
  
  bidfx_public_api::price::pixie::AckMessage::AckMessage
            (local_40,0x12d687,0x1497bc5cce8,0x1497bc5cdb0,0x1497bc5cdb1,0x29a);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::AckMessage,bidfx_public_api::price::pixie::AckMessage>
            (local_50,"ackMessage","newMessage",(AckMessage *)ackMessage,local_40);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()
                 (&local_51,(AckMessage *)ackMessage);
  local_60.data_ =
       (AssertHelperData *)
       std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()(&local_52,local_40);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"std::hash<AckMessage>()(ackMessage)","std::hash<AckMessage>()(newMessage)",
             (unsigned_long *)&local_68,(unsigned_long *)&local_60);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(AckMessageTest, TestEqualsSimilar)
{
    AckMessage newMessage = AckMessage(1234567, 1415120801000L, 1415120801200L, 1415120801201L, 666L);
    EXPECT_EQ(ackMessage, newMessage);
    EXPECT_EQ(std::hash<AckMessage>()(ackMessage), std::hash<AckMessage>()(newMessage));
}